

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
* __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvarianceTestInstance::genTessLevelCases
          (vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
           *__return_storage_ptr__,InvarianceTestInstance *this)

{
  float fVar1;
  LevelCase local_a0;
  int local_80;
  int local_7c;
  int j_1;
  int j;
  TessLevels levels;
  int i_1;
  Random rnd;
  LevelCase local_40;
  int local_20;
  undefined1 local_19;
  int i;
  InvarianceTestInstance *this_local;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  *result;
  
  local_19 = 0;
  _i = this;
  this_local = (InvarianceTestInstance *)__return_storage_ptr__;
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  ::vector(__return_storage_ptr__);
  for (local_20 = 0; local_20 < 9; local_20 = local_20 + 1) {
    LevelCase::LevelCase(&local_40,genTessLevelCases::basicTessLevelCases + local_20);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
    ::push_back(__return_storage_ptr__,&local_40);
    LevelCase::~LevelCase(&local_40);
  }
  de::Random::Random((Random *)(levels.outer + 3),0x7b);
  for (levels.outer[2] = 0.0; (int)levels.outer[2] < 10;
      levels.outer[2] = (float)((int)levels.outer[2] + 1)) {
    for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
      fVar1 = de::Random::getFloat((Random *)(levels.outer + 3),1.0,16.0);
      (&j_1)[local_7c] = (int)fVar1;
    }
    for (local_80 = 0; local_80 < 4; local_80 = local_80 + 1) {
      fVar1 = de::Random::getFloat((Random *)(levels.outer + 3),1.0,16.0);
      levels.inner[local_80] = fVar1;
    }
    LevelCase::LevelCase(&local_a0,(TessLevels *)&j_1);
    std::
    vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
    ::push_back(__return_storage_ptr__,&local_a0);
    LevelCase::~LevelCase(&local_a0);
  }
  de::Random::~Random((Random *)(levels.outer + 3));
  return __return_storage_ptr__;
}

Assistant:

std::vector<LevelCase> InvarianceTestInstance::genTessLevelCases (void) const
{
	static const TessLevels basicTessLevelCases[] =
	{
		{ { 1.0f,	1.0f	},	{ 1.0f,		1.0f,	1.0f,	1.0f	} },
		{ { 63.0f,	24.0f	},	{ 15.0f,	42.0f,	10.0f,	12.0f	} },
		{ { 3.0f,	2.0f	},	{ 6.0f,		8.0f,	7.0f,	9.0f	} },
		{ { 4.0f,	6.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 2.0f,	2.0f	},	{ 6.0f,		8.0f,	7.0f,	9.0f	} },
		{ { 5.0f,	6.0f	},	{ 1.0f,		1.0f,	1.0f,	1.0f	} },
		{ { 1.0f,	6.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 5.0f,	1.0f	},	{ 2.0f,		3.0f,	1.0f,	4.0f	} },
		{ { 5.2f,	1.6f	},	{ 2.9f,		3.4f,	1.5f,	4.1f	} }
	};

	std::vector<LevelCase> result;
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(basicTessLevelCases); ++i)
		result.push_back(LevelCase(basicTessLevelCases[i]));

	{
		de::Random rnd(123);
		for (int i = 0; i < 10; ++i)
		{
			TessLevels levels;
			for (int j = 0; j < DE_LENGTH_OF_ARRAY(levels.inner); ++j)
				levels.inner[j] = rnd.getFloat(1.0f, 16.0f);
			for (int j = 0; j < DE_LENGTH_OF_ARRAY(levels.outer); ++j)
				levels.outer[j] = rnd.getFloat(1.0f, 16.0f);
			result.push_back(LevelCase(levels));
		}
	}

	return result;
}